

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O3

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
          (AsyncQueue<nrg::PrioExecution> *this,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *param,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_3)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    PrioExecution::
    push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>
              (&this->queue_,param,param_2,param_3);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }